

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O2

Matrix<double,_1,_2,_1,_1,_2> * __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,1,2,1,1,2>>::
_set_noalias<Eigen::Block<Eigen::Matrix<double,_1,2,1,_1,2>const,1,2,true>>
          (PlainObjectBase<Eigen::Matrix<double,1,2,1,1,2>> *this,
          DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_2,_1,__1,_2>,_1,_2,_true>_> *other)

{
  ActualDstType actualDst;
  assign_op<double,_double> local_9;
  
  internal::
  call_dense_assignment_loop<Eigen::Matrix<double,1,2,1,1,2>,Eigen::Block<Eigen::Matrix<double,_1,2,1,_1,2>const,1,2,true>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,_1,_2,_1,_1,_2> *)this,
             (Block<const_Eigen::Matrix<double,__1,_2,_1,__1,_2>,_1,_2,_true> *)other,&local_9);
  return (Matrix<double,_1,_2,_1,_1,_2> *)this;
}

Assistant:

EIGEN_DEVICE_FUNC 
    EIGEN_STRONG_INLINE Derived& _set_noalias(const DenseBase<OtherDerived>& other)
    {
      // I don't think we need this resize call since the lazyAssign will anyways resize
      // and lazyAssign will be called by the assign selector.
      //_resize_to_match(other);
      // the 'false' below means to enforce lazy evaluation. We don't use lazyAssign() because
      // it wouldn't allow to copy a row-vector into a column-vector.
      internal::call_assignment_no_alias(this->derived(), other.derived(), internal::assign_op<Scalar,typename OtherDerived::Scalar>());
      return this->derived();
    }